

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int DisconnectIM483Ix(IM483I *pIM483I)

{
  int iVar1;
  char *__s;
  long lVar2;
  
  lVar2 = 0;
  while ((IM483I *)addrsIM483I[lVar2] != pIM483I) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x10) {
      return 1;
    }
  }
  iVar1 = CloseRS232Port(&pIM483I->RS232Port);
  __s = "IM483I disconnection failed.";
  if (iVar1 == 0) {
    __s = "IM483I disconnected.";
  }
  puts(__s);
  if (iVar1 != 0) {
    return 1;
  }
  addrsIM483I[lVar2] = (void *)0x0;
  return 0;
}

Assistant:

HARDWAREX_API int DisconnectIM483Ix(IM483I* pIM483I)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectIM483I(pIM483I);
	if (res != EXIT_SUCCESS) return res;

	addrsIM483I[id] = NULL;

	return EXIT_SUCCESS;
}